

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O0

void cff_builder_init(CFF_Builder *builder,TT_Face face,CFF_Size size,CFF_GlyphSlot glyph,
                     FT_Bool hinting)

{
  FT_GlyphLoader loader_00;
  undefined8 *puVar1;
  CFF_Internal internal;
  FT_Size ftsize;
  FT_GlyphLoader loader;
  FT_Bool hinting_local;
  CFF_GlyphSlot glyph_local;
  CFF_Size size_local;
  TT_Face face_local;
  CFF_Builder *builder_local;
  
  builder->path_begun = '\0';
  builder->load_points = '\x01';
  builder->face = face;
  builder->glyph = glyph;
  builder->memory = (face->root).memory;
  if (glyph != (CFF_GlyphSlot)0x0) {
    loader_00 = ((glyph->root).internal)->loader;
    builder->loader = loader_00;
    builder->base = &(loader_00->base).outline;
    builder->current = &(loader_00->current).outline;
    FT_GlyphLoader_Rewind(loader_00);
    builder->hints_globals = (void *)0x0;
    builder->hints_funcs = (void *)0x0;
    if (((hinting != '\0') && (size != (CFF_Size)0x0)) &&
       (puVar1 = (undefined8 *)((size->root).internal)->module_data, puVar1 != (undefined8 *)0x0)) {
      builder->hints_globals = (void *)*puVar1;
      builder->hints_funcs = ((glyph->root).internal)->glyph_hints;
    }
  }
  builder->pos_x = 0;
  builder->pos_y = 0;
  (builder->left_bearing).x = 0;
  (builder->left_bearing).y = 0;
  (builder->advance).x = 0;
  (builder->advance).y = 0;
  memcpy(&builder->funcs,&cff_builder_funcs,0x40);
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  cff_builder_init( CFF_Builder*   builder,
                    TT_Face        face,
                    CFF_Size       size,
                    CFF_GlyphSlot  glyph,
                    FT_Bool        hinting )
  {
    builder->path_begun  = 0;
    builder->load_points = 1;

    builder->face   = face;
    builder->glyph  = glyph;
    builder->memory = face->root.memory;

    if ( glyph )
    {
      FT_GlyphLoader  loader = glyph->root.internal->loader;


      builder->loader  = loader;
      builder->base    = &loader->base.outline;
      builder->current = &loader->current.outline;
      FT_GlyphLoader_Rewind( loader );

      builder->hints_globals = NULL;
      builder->hints_funcs   = NULL;

      if ( hinting && size )
      {
        FT_Size       ftsize   = FT_SIZE( size );
        CFF_Internal  internal = (CFF_Internal)ftsize->internal->module_data;

        if ( internal )
        {
          builder->hints_globals = (void *)internal->topfont;
          builder->hints_funcs   = glyph->root.internal->glyph_hints;
        }
      }
    }

    builder->pos_x = 0;
    builder->pos_y = 0;

    builder->left_bearing.x = 0;
    builder->left_bearing.y = 0;
    builder->advance.x      = 0;
    builder->advance.y      = 0;

    builder->funcs = cff_builder_funcs;
  }